

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O3

Mat * imagestego::impl::HaarWavelet::verticalLifting(Mat *src)

{
  Mat m;
  Mat local_3a0 [96];
  HaarWavelet local_340 [96];
  long *local_2e0 [2];
  Mat local_2d0 [96];
  Mat local_270 [96];
  Mat aMStack_210 [144];
  long *local_180 [2];
  Mat local_170 [96];
  Mat local_110 [96];
  Mat aMStack_b0 [144];
  
  cv::Mat::t();
  cv::Mat::Mat(local_3a0);
  (**(code **)(*local_180[0] + 0x18))(local_180[0],local_180,local_3a0,0xffffffff);
  horizontalLifting(local_340,local_3a0);
  cv::Mat::t();
  cv::Mat::Mat(src);
  (**(code **)(*local_2e0[0] + 0x18))(local_2e0[0],local_2e0,src,0xffffffff);
  cv::Mat::~Mat(aMStack_210);
  cv::Mat::~Mat(local_270);
  cv::Mat::~Mat(local_2d0);
  cv::Mat::~Mat((Mat *)local_340);
  cv::Mat::~Mat(local_3a0);
  cv::Mat::~Mat(aMStack_b0);
  cv::Mat::~Mat(local_110);
  cv::Mat::~Mat(local_170);
  return src;
}

Assistant:

static inline cv::Mat verticalLifting(const cv::Mat& src) {
        return horizontalLifting(src.t()).t();
    }